

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader15::begin__instance_node
          (NodeLoader15 *this,instance_node__AttributeData *attributeData)

{
  uint uVar1;
  int iVar2;
  instance_node__AttributeData local_200;
  
  instance_node__AttributeData::instance_node__AttributeData(&local_200);
  local_200.present_attributes = 0;
  local_200.sid = attributeData->sid;
  local_200.name = attributeData->name;
  uVar1 = attributeData->present_attributes;
  if ((uVar1 & 2) != 0) {
    COLLADABU::URI::operator=(&local_200.url,&attributeData->url);
    local_200.present_attributes = local_200.present_attributes | 2;
    uVar1 = attributeData->present_attributes;
  }
  if ((uVar1 & 1) != 0) {
    COLLADABU::URI::operator=(&local_200.proxy,&attributeData->proxy);
    local_200.present_attributes = local_200.present_attributes | 1;
  }
  iVar2 = (*(this->mLoader->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x20])
                    (this->mLoader,&local_200);
  instance_node__AttributeData::~instance_node__AttributeData(&local_200);
  return SUB41(iVar2,0);
}

Assistant:

bool NodeLoader15::begin__instance_node( const COLLADASaxFWL15::instance_node__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_node(attributeData));
COLLADASaxFWL::instance_node__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT) == COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT ) {
    attrData.proxy = attributeData.proxy;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT;
}
return mLoader->begin__instance_node(attrData);
}